

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  unsigned_long uVar1;
  ostream *poVar2;
  future<unsigned_long> local_30;
  ulong local_20;
  unsigned_long result;
  char **param_1_local;
  int param_0_local;
  
  param_1_local._4_4_ = 0;
  result = (unsigned_long)param_2;
  param_1_local._0_4_ = param_1;
  std::async<unsigned_long(&)(unsigned_long),unsigned_long_const&>
            ((launch)&local_30,(_func_unsigned_long_unsigned_long *)0x1,
             (unsigned_long *)anon_unknown.dwarf_b2e3::call_function);
  uVar1 = std::future<unsigned_long>::get(&local_30);
  std::future<unsigned_long>::~future(&local_30);
  local_20 = uVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"Factorial(20) => ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
  poVar2 = std::operator<<(poVar2," == ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x21c3677c82b40000);
  poVar2 = std::operator<<(poVar2," <= Should be");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Number of calls should be #");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xa000);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int, char **)
{
  const auto result = std::async(std::launch::async, call_function, N).get();

  std::cout << "Factorial(20) => " << result << " == " << 2432902008176640000ull << " <= Should be" << std::endl;
  std::cout << "Number of calls should be #" << N << std::endl;

  return 0;
}